

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation_half.cpp
# Opt level: O2

void show(fp_t d)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  bitset<64UL> local_8;
  
  printf("%.18f\t");
  printf("0x%016lx\t",d);
  local_8.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)d;
  pbVar1 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_8);
  std::endl<char,std::char_traits<char>>(pbVar1);
  return;
}

Assistant:

void show(fp_t d)
{
    #ifdef FLEXFLOAT_ON_QUAD
    char buffer[128];
    quadmath_snprintf(buffer, sizeof buffer, "%.38Qf", d);
    printf("%s\t", buffer);
    #else
    printf(PRINTF_FORMAT "\t", d);
    #endif
    uint_t u = *((uint_t *) &d);
    #ifdef FLEXFLOAT_ON_SINGLE
    printf("0x%016x\t", u);
    #endif
    #ifdef FLEXFLOAT_ON_DOUBLE
    printf("0x%016lx\t", u);
    #endif    
    std::cout << std::bitset<NUM_BITS>(u) << std::endl;
}